

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_memory.c
# Opt level: O1

ssize_t memory_read(archive *a,void *client_data,void **buff)

{
  long lVar1;
  
  *buff = *(void **)((long)client_data + 8);
  lVar1 = *(long *)((long)client_data + 0x10) - *(long *)((long)client_data + 8);
  if (*(long *)((long)client_data + 0x18) <= lVar1) {
    lVar1 = *(long *)((long)client_data + 0x18);
  }
  *(long *)((long)client_data + 8) = *(long *)((long)client_data + 8) + lVar1;
  return lVar1;
}

Assistant:

static ssize_t
memory_read(struct archive *a, void *client_data, const void **buff)
{
	struct read_memory_data *mine = (struct read_memory_data *)client_data;
	ssize_t size;

	(void)a; /* UNUSED */
	*buff = mine->p;
	size = mine->end - mine->p;
	if (size > mine->read_size)
		size = mine->read_size;
        mine->p += size;
	return (size);
}